

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

void archive_string_conversion_free(archive *a)

{
  archive_string_conv *paVar1;
  archive_string_conv *sc;
  
  sc = a->sconv;
  while (sc != (archive_string_conv *)0x0) {
    paVar1 = sc->next;
    free_sconv_object(sc);
    sc = paVar1;
  }
  a->sconv = (archive_string_conv *)0x0;
  free(a->current_code);
  a->current_code = (char *)0x0;
  return;
}

Assistant:

void
archive_string_conversion_free(struct archive *a)
{
	struct archive_string_conv *sc; 
	struct archive_string_conv *sc_next; 

	for (sc = a->sconv; sc != NULL; sc = sc_next) {
		sc_next = sc->next;
		free_sconv_object(sc);
	}
	a->sconv = NULL;
	free(a->current_code);
	a->current_code = NULL;
}